

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

void __thiscall icu_63::RuleChain::dumpRules(RuleChain *this,UnicodeString *result)

{
  int32_t *piVar1;
  long lVar2;
  AndConstraint *pAVar3;
  long lVar4;
  uint32_t i;
  OrConstraint *pOVar5;
  ConstChar16Ptr local_1f0;
  ConstChar16Ptr local_1e8;
  ConstChar16Ptr local_1e0;
  ConstChar16Ptr local_1d8;
  ConstChar16Ptr local_1d0;
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  ConstChar16Ptr local_1a8;
  ConstChar16Ptr local_1a0;
  ConstChar16Ptr local_198;
  ConstChar16Ptr local_190;
  UnicodeString local_188;
  ConstChar16Ptr local_148;
  OrConstraint *local_140;
  char16_t *local_138;
  char16_t *local_128;
  char16_t *local_118;
  char16_t *local_108;
  char16_t *local_f8;
  char16_t *local_e8;
  char16_t *local_d8;
  char16_t *local_c8;
  char16_t *local_b8;
  char16_t *local_a8;
  char16_t *local_98;
  char16_t *local_88;
  char16_t *local_78;
  char16_t *local_68;
  UChar digitString [16];
  
  if (this->ruleHeader != (OrConstraint *)0x0) {
    UnicodeString::operator+=(result,&this->fKeyword);
    UnicodeString::operator+=(result,L':');
    UnicodeString::operator+=(result,L' ');
    pOVar5 = this->ruleHeader;
    while (pOVar5 != (OrConstraint *)0x0) {
      pAVar3 = pOVar5->childNode;
      local_140 = pOVar5;
      while (pAVar3 != (AndConstraint *)0x0) {
        if ((pAVar3->op == NONE) && (pAVar3->rangeList == (UVector32 *)0x0)) {
          if (pAVar3->value != -1) {
            tokenString(&local_188,pAVar3->digitsType);
            UnicodeString::operator+=(result,&local_188);
            UnicodeString::~UnicodeString(&local_188);
            local_190.p_ = L" is ";
            UnicodeString::UnicodeString(&local_188,'\x01',&local_190,-1);
            UnicodeString::operator+=(result,&local_188);
            UnicodeString::~UnicodeString(&local_188);
            local_f8 = local_190.p_;
            if (pAVar3->negated != '\0') {
              local_198.p_ = L"not ";
              UnicodeString::UnicodeString(&local_188,'\x01',&local_198,-1);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_108 = local_198.p_;
            }
            uprv_itou_63(digitString,0x10,pAVar3->value,10,0);
            UnicodeString::UnicodeString(&local_188,digitString);
            UnicodeString::operator+=(result,&local_188);
            goto LAB_0026af7e;
          }
        }
        else {
          tokenString(&local_188,pAVar3->digitsType);
          UnicodeString::operator+=(result,&local_188);
          UnicodeString::~UnicodeString(&local_188);
          UnicodeString::operator+=(result,L' ');
          if (pAVar3->op == MOD) {
            local_1a0.p_ = L"mod ";
            UnicodeString::UnicodeString(&local_188,'\x01',&local_1a0,-1);
            UnicodeString::operator+=(result,&local_188);
            UnicodeString::~UnicodeString(&local_188);
            local_68 = local_1a0.p_;
            uprv_itou_63(digitString,0x10,pAVar3->opNum,10,0);
            UnicodeString::UnicodeString(&local_188,digitString);
            UnicodeString::operator+=(result,&local_188);
            UnicodeString::~UnicodeString(&local_188);
          }
          if (pAVar3->rangeList == (UVector32 *)0x0) {
            if (pAVar3->negated == '\0') {
              local_1b0.p_ = L" is ";
              UnicodeString::UnicodeString(&local_188,'\x01',&local_1b0,-1);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_e8 = local_1b0.p_;
              uprv_itou_63(digitString,0x10,pAVar3->value,10,0);
              UnicodeString::UnicodeString(&local_188,digitString);
              UnicodeString::operator+=(result,&local_188);
            }
            else {
              local_1a8.p_ = L" is not ";
              UnicodeString::UnicodeString(&local_188,'\x01',&local_1a8,-1);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_d8 = local_1a8.p_;
              uprv_itou_63(digitString,0x10,pAVar3->value,10,0);
              UnicodeString::UnicodeString(&local_188,digitString);
              UnicodeString::operator+=(result,&local_188);
            }
LAB_0026af7e:
            UnicodeString::~UnicodeString(&local_188);
          }
          else {
            if (pAVar3->negated == '\0') {
              if (pAVar3->integerOnly == '\0') {
                local_1d0.p_ = L" within ";
                UnicodeString::UnicodeString(&local_188,'\x01',&local_1d0,-1);
                UnicodeString::operator+=(result,&local_188);
                UnicodeString::~UnicodeString(&local_188);
                local_a8 = local_1d0.p_;
              }
              else {
                local_1c8.p_ = L" in ";
                UnicodeString::UnicodeString(&local_188,'\x01',&local_1c8,-1);
                UnicodeString::operator+=(result,&local_188);
                UnicodeString::~UnicodeString(&local_188);
                local_98 = local_1c8.p_;
              }
            }
            else if (pAVar3->integerOnly == '\0') {
              local_1c0.p_ = L" not within ";
              UnicodeString::UnicodeString(&local_188,'\x01',&local_1c0,-1);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_88 = local_1c0.p_;
            }
            else {
              local_1b8.p_ = L" not in ";
              UnicodeString::UnicodeString(&local_188,'\x01',&local_1b8,-1);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_78 = local_1b8.p_;
            }
            lVar4 = 0;
            while( true ) {
              lVar2 = (long)pAVar3->rangeList->count;
              if (lVar2 <= lVar4) break;
              piVar1 = pAVar3->rangeList->elements;
              i = 0;
              if (lVar4 + 1 < lVar2) {
                i = piVar1[lVar4 + 1];
              }
              uprv_itou_63(digitString,0x10,piVar1[lVar4],10,0);
              UnicodeString::UnicodeString(&local_188,digitString);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_1d8.p_ = L"..";
              UnicodeString::UnicodeString(&local_188,'\x01',&local_1d8,-1);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              local_b8 = local_1d8.p_;
              uprv_itou_63(digitString,0x10,i,10,0);
              UnicodeString::UnicodeString(&local_188,digitString);
              UnicodeString::operator+=(result,&local_188);
              UnicodeString::~UnicodeString(&local_188);
              lVar4 = lVar4 + 2;
              if ((int)lVar4 < pAVar3->rangeList->count) {
                local_1e0.p_ = L", ";
                UnicodeString::UnicodeString(&local_188,'\x01',&local_1e0,-1);
                UnicodeString::operator+=(result,&local_188);
                UnicodeString::~UnicodeString(&local_188);
                local_c8 = local_1e0.p_;
              }
            }
          }
        }
        pAVar3 = pAVar3->next;
        if (pAVar3 != (AndConstraint *)0x0) {
          local_1e8.p_ = L" and ";
          UnicodeString::UnicodeString(&local_188,'\x01',&local_1e8,-1);
          UnicodeString::operator+=(result,&local_188);
          UnicodeString::~UnicodeString(&local_188);
          local_118 = local_1e8.p_;
        }
      }
      pOVar5 = local_140->next;
      if (pOVar5 != (OrConstraint *)0x0) {
        local_1f0.p_ = L" or ";
        UnicodeString::UnicodeString(&local_188,'\x01',&local_1f0,-1);
        UnicodeString::operator+=(result,&local_188);
        UnicodeString::~UnicodeString(&local_188);
        local_128 = local_1f0.p_;
      }
    }
  }
  if (this->fNext != (RuleChain *)0x0) {
    local_148.p_ = L"; ";
    UnicodeString::UnicodeString(&local_188,'\x01',&local_148,-1);
    UnicodeString::operator+=(result,&local_188);
    UnicodeString::~UnicodeString(&local_188);
    local_138 = local_148.p_;
    dumpRules(this->fNext,result);
  }
  return;
}

Assistant:

void
RuleChain::dumpRules(UnicodeString& result) {
    UChar digitString[16];

    if ( ruleHeader != nullptr ) {
        result +=  fKeyword;
        result += COLON;
        result += SPACE;
        OrConstraint* orRule=ruleHeader;
        while ( orRule != nullptr ) {
            AndConstraint* andRule=orRule->childNode;
            while ( andRule != nullptr ) {
                if ((andRule->op==AndConstraint::NONE) &&  (andRule->rangeList==nullptr) && (andRule->value == -1)) {
                    // Empty Rules.
                } else if ( (andRule->op==AndConstraint::NONE) && (andRule->rangeList==nullptr) ) {
                    result += tokenString(andRule->digitsType);
                    result += UNICODE_STRING_SIMPLE(" is ");
                    if (andRule->negated) {
                        result += UNICODE_STRING_SIMPLE("not ");
                    }
                    uprv_itou(digitString,16, andRule->value,10,0);
                    result += UnicodeString(digitString);
                }
                else {
                    result += tokenString(andRule->digitsType);
                    result += SPACE;
                    if (andRule->op==AndConstraint::MOD) {
                        result += UNICODE_STRING_SIMPLE("mod ");
                        uprv_itou(digitString,16, andRule->opNum,10,0);
                        result += UnicodeString(digitString);
                    }
                    if (andRule->rangeList==nullptr) {
                        if (andRule->negated) {
                            result += UNICODE_STRING_SIMPLE(" is not ");
                            uprv_itou(digitString,16, andRule->value,10,0);
                            result += UnicodeString(digitString);
                        }
                        else {
                            result += UNICODE_STRING_SIMPLE(" is ");
                            uprv_itou(digitString,16, andRule->value,10,0);
                            result += UnicodeString(digitString);
                        }
                    }
                    else {
                        if (andRule->negated) {
                            if ( andRule->integerOnly ) {
                                result += UNICODE_STRING_SIMPLE(" not in ");
                            }
                            else {
                                result += UNICODE_STRING_SIMPLE(" not within ");
                            }
                        }
                        else {
                            if ( andRule->integerOnly ) {
                                result += UNICODE_STRING_SIMPLE(" in ");
                            }
                            else {
                                result += UNICODE_STRING_SIMPLE(" within ");
                            }
                        }
                        for (int32_t r=0; r<andRule->rangeList->size(); r+=2) {
                            int32_t rangeLo = andRule->rangeList->elementAti(r);
                            int32_t rangeHi = andRule->rangeList->elementAti(r+1);
                            uprv_itou(digitString,16, rangeLo, 10, 0);
                            result += UnicodeString(digitString);
                            result += UNICODE_STRING_SIMPLE("..");
                            uprv_itou(digitString,16, rangeHi, 10,0);
                            result += UnicodeString(digitString);
                            if (r+2 < andRule->rangeList->size()) {
                                result += UNICODE_STRING_SIMPLE(", ");
                            }
                        }
                    }
                }
                if ( (andRule=andRule->next) != nullptr) {
                    result += UNICODE_STRING_SIMPLE(" and ");
                }
            }
            if ( (orRule = orRule->next) != nullptr ) {
                result += UNICODE_STRING_SIMPLE(" or ");
            }
        }
    }
    if ( fNext != nullptr ) {
        result += UNICODE_STRING_SIMPLE("; ");
        fNext->dumpRules(result);
    }
}